

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::initFactorRings(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this)

{
  Pring **p;
  Pring **p_00;
  int iVar1;
  int *piVar2;
  int *piVar3;
  Pring *pPVar4;
  Pring *pPVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  Pring *pPVar9;
  long lVar10;
  Pring *pPVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  piVar2 = (this->row).perm;
  piVar3 = (this->col).perm;
  spx_alloc<soplex::CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::Pring*>
            (&(this->temp).pivot_col,this->thedim + 1);
  p = &(this->temp).pivot_colNZ;
  spx_alloc<soplex::CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::Pring*>
            (p,this->thedim + 1);
  spx_alloc<soplex::CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::Pring*>
            (&(this->temp).pivot_row,this->thedim + 1);
  p_00 = &(this->temp).pivot_rowNZ;
  spx_alloc<soplex::CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::Pring*>
            (p_00,this->thedim + 1);
  iVar1 = this->thedim;
  uVar7 = iVar1 - (this->temp).stage;
  if (-1 < (int)uVar7) {
    iVar8 = uVar7 + 1;
    pPVar11 = *p_00 + uVar7;
    pPVar9 = *p + uVar7;
    do {
      pPVar9->next = pPVar9;
      pPVar9->prev = pPVar9;
      pPVar11->next = pPVar11;
      pPVar11->prev = pPVar11;
      iVar8 = iVar8 + -1;
      pPVar11 = pPVar11 + -1;
      pPVar9 = pPVar9 + -1;
    } while (0 < iVar8);
  }
  if (0 < iVar1) {
    lVar13 = 0;
    lVar14 = 0;
    lVar10 = 0;
    lVar12 = 0;
    do {
      if (*(int *)((long)piVar2 + lVar10) < 0) {
        lVar6 = (long)*(int *)((long)(this->u).row.len + lVar10);
        if (lVar6 < 1) goto LAB_0027d085;
        pPVar11 = (this->temp).pivot_row;
        pPVar4 = (this->temp).pivot_rowNZ;
        pPVar5 = pPVar4[lVar6].next;
        pPVar9 = (Pring *)((long)&pPVar11->next + lVar14);
        (&pPVar11->next)[lVar10] = pPVar5;
        pPVar5->prev = pPVar9;
        (&pPVar11->prev)[lVar10] = pPVar4 + lVar6;
        pPVar4[lVar6].next = pPVar9;
        (&pPVar11->idx)[lVar10 * 2] = (int)lVar12;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)
                   ((long)(((this->temp).s_max.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar13),-1);
      }
      if (*(int *)((long)piVar3 + lVar10) < 0) {
        lVar6 = (long)*(int *)((long)(this->temp).s_cact + lVar10);
        if (lVar6 < 1) {
LAB_0027d085:
          this->stat = SINGULAR;
          return;
        }
        pPVar11 = (this->temp).pivot_col;
        pPVar4 = (this->temp).pivot_colNZ;
        pPVar5 = pPVar4[lVar6].next;
        pPVar9 = (Pring *)((long)&pPVar11->next + lVar14);
        (&pPVar11->next)[lVar10] = pPVar5;
        pPVar5->prev = pPVar9;
        (&pPVar11->prev)[lVar10] = pPVar4 + lVar6;
        pPVar4[lVar6].next = pPVar9;
        (&pPVar11->idx)[lVar10 * 2] = (int)lVar12;
        *(undefined4 *)((long)(this->temp).s_mark + lVar10) = 0;
      }
      lVar12 = lVar12 + 1;
      lVar10 = lVar10 + 4;
      lVar14 = lVar14 + 0x20;
      lVar13 = lVar13 + 0x38;
    } while (lVar12 < this->thedim);
  }
  return;
}

Assistant:

void CLUFactor<R>::initFactorRings()
{
   int i;
   int* rperm = row.perm;
   int* cperm = col.perm;
   CLUFactor<R>::Pring* ring;

   assert(thedim >= 0);
   spx_alloc(temp.pivot_col,   thedim + 1);
   spx_alloc(temp.pivot_colNZ, thedim + 1);
   spx_alloc(temp.pivot_row,   thedim + 1);
   spx_alloc(temp.pivot_rowNZ, thedim + 1);

   for(i = thedim - temp.stage; i >= 0; --i)
   {
      initDR(temp.pivot_colNZ[i]);
      initDR(temp.pivot_rowNZ[i]);
   }

   for(i = 0; i < thedim; ++i)
   {
      if(rperm[i] < 0)
      {
         if(u.row.len[i] <= 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }

         ring = &(temp.pivot_rowNZ[u.row.len[i]]);

         init2DR(temp.pivot_row[i], *ring);
         temp.pivot_row[i].idx = i;
         temp.s_max[i] = -1;
      }

      if(cperm[i] < 0)
      {
         if(temp.s_cact[i] <= 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }

         ring = &(temp.pivot_colNZ[temp.s_cact[i]]);

         init2DR(temp.pivot_col[i], *ring);
         temp.pivot_col[i].idx = i;
         temp.s_mark[i] = 0;
      }
   }
}